

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_wrapper.cpp
# Opt level: O2

int duckdb::ResultArrowArrayStreamWrapper::MyStreamGetSchema
              (ArrowArrayStream *stream,ArrowSchema *out)

{
  unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *this;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *this_00;
  void *pvVar1;
  bool bVar2;
  pointer pQVar3;
  type this_01;
  ErrorData *pEVar4;
  StreamQueryResult *this_02;
  int iVar5;
  allocator local_d1;
  string local_d0;
  ErrorData local_b0;
  
  iVar5 = -1;
  if (stream->release != (_func_void_ArrowArrayStream_ptr *)0x0) {
    out->release = (_func_void_ArrowSchema_ptr *)0x0;
    pvVar1 = stream->private_data;
    this_00 = (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
              ((long)pvVar1 + 0xb8);
    this = (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
           ((long)pvVar1 + 0x28);
    if (*(long *)((long)pvVar1 + 0xb8) == *(long *)((long)pvVar1 + 0xc0)) {
      this_01 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
                operator*(this);
      bVar2 = BaseQueryResult::HasError(&this_01->super_BaseQueryResult);
      if (bVar2) {
        pEVar4 = BaseQueryResult::GetErrorObject(&this_01->super_BaseQueryResult);
        ErrorData::operator=((ErrorData *)((long)pvVar1 + 0x30),pEVar4);
        return -1;
      }
      if ((this_01->super_BaseQueryResult).type == STREAM_RESULT) {
        this_02 = QueryResult::Cast<duckdb::StreamQueryResult>(this_01);
        bVar2 = StreamQueryResult::IsOpen(this_02);
        if (!bVar2) {
          ::std::__cxx11::string::string((string *)&local_d0,"Query Stream is closed",&local_d1);
          ErrorData::ErrorData(&local_b0,&local_d0);
          ErrorData::operator=((ErrorData *)((long)pvVar1 + 0x30),&local_b0);
          ErrorData::~ErrorData(&local_b0);
          ::std::__cxx11::string::~string((string *)&local_d0);
          return -1;
        }
      }
      if (*(long *)((long)pvVar1 + 0xb8) == *(long *)((long)pvVar1 + 0xc0)) {
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
                  (this_00,&(this_01->super_BaseQueryResult).types.
                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
        ;
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)pvVar1 + 0xd0),
                    &(this_01->super_BaseQueryResult).names.
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   );
      }
      pQVar3 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
               operator->(this);
      ArrowConverter::ToArrowSchema
                (out,(vector<duckdb::LogicalType,_true> *)this_00,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)((long)pvVar1 + 0xd0),&pQVar3->client_properties);
    }
    else {
      pQVar3 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
               operator->(this);
      ArrowConverter::ToArrowSchema
                (out,(vector<duckdb::LogicalType,_true> *)this_00,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)((long)pvVar1 + 0xd0),&pQVar3->client_properties);
    }
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int ResultArrowArrayStreamWrapper::MyStreamGetSchema(struct ArrowArrayStream *stream, struct ArrowSchema *out) {
	if (!stream->release) {
		return -1;
	}
	out->release = nullptr;
	auto my_stream = reinterpret_cast<ResultArrowArrayStreamWrapper *>(stream->private_data);
	if (!my_stream->column_types.empty()) {
		try {
			ArrowConverter::ToArrowSchema(out, my_stream->column_types, my_stream->column_names,
			                              my_stream->result->client_properties);
		} catch (std::runtime_error &e) {
			my_stream->last_error = ErrorData(e);
			return -1;
		}
		return 0;
	}

	auto &result = *my_stream->result;
	if (result.HasError()) {
		my_stream->last_error = result.GetErrorObject();
		return -1;
	}
	if (result.type == QueryResultType::STREAM_RESULT) {
		auto &stream_result = result.Cast<StreamQueryResult>();
		if (!stream_result.IsOpen()) {
			my_stream->last_error = ErrorData("Query Stream is closed");
			return -1;
		}
	}
	if (my_stream->column_types.empty()) {
		my_stream->column_types = result.types;
		my_stream->column_names = result.names;
	}
	try {
		ArrowConverter::ToArrowSchema(out, my_stream->column_types, my_stream->column_names,
		                              my_stream->result->client_properties);
	} catch (std::runtime_error &e) {
		my_stream->last_error = ErrorData(e);
		return -1;
	}
	return 0;
}